

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Sampler::writeTo(Sampler *this,BinaryWriter *binary)

{
  BinaryWriter *in_RDI;
  int samplerType;
  int *in_stack_ffffffffffffffd8;
  
  BinaryWriter::write<int>(in_RDI,in_stack_ffffffffffffffd8);
  BinaryWriter::write<int>(in_RDI,in_stack_ffffffffffffffd8);
  BinaryWriter::write<int>(in_RDI,in_stack_ffffffffffffffd8);
  BinaryWriter::write<int>(in_RDI,in_stack_ffffffffffffffd8);
  return 8;
}

Assistant:

int Sampler::writeTo(BinaryWriter &binary) {
      int samplerType = static_cast<int>(type);
      binary.write(samplerType);
      binary.write(pixelSamples);
      binary.write(xSamples);
      binary.write(ySamples);
      return TYPE_SAMPLER;
  }